

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MFIter.cpp
# Opt level: O3

void __thiscall
amrex::MFIter::MFIter(MFIter *this,BoxArray *ba,DistributionMapping *dm,bool do_tiling_)

{
  _Head_base<0UL,_amrex::FabArrayBase_*,_false> this_00;
  pointer *__ptr;
  
  this_00._M_head_impl = (FabArrayBase *)operator_new(0xf0);
  FabArrayBase::FabArrayBase(this_00._M_head_impl,ba,dm,1,0);
  (this->m_fa)._M_t.
  super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
  super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
  super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl = this_00._M_head_impl;
  this->fabArray = this_00._M_head_impl;
  if (do_tiling_) {
    (this->tile_size).vect[2] = DAT_00717ec0;
    *(undefined8 *)(this->tile_size).vect = FabArrayBase::mfiter_tile_size;
  }
  else {
    (this->tile_size).vect[0] = 0;
    (this->tile_size).vect[1] = 0;
    (this->tile_size).vect[2] = 0;
  }
  this->flags = do_tiling_;
  this->streams = Gpu::Device::max_gpu_streams;
  (this->typ).itype = 0;
  this->dynamic = false;
  this->device_sync = true;
  this->index_map = (Vector<int,_std::allocator<int>_> *)0x0;
  this->local_index_map = (Vector<int,_std::allocator<int>_> *)0x0;
  this->tile_array = (Vector<amrex::Box,_std::allocator<amrex::Box>_> *)0x0;
  this->local_tile_index_map = (Vector<int,_std::allocator<int>_> *)0x0;
  this->num_local_tiles = (Vector<int,_std::allocator<int>_> *)0x0;
  FabArrayBase::addThisBD(this_00._M_head_impl);
  Initialize(this);
  return;
}

Assistant:

MFIter::MFIter (const BoxArray& ba, const DistributionMapping& dm, bool do_tiling_)
    :
    m_fa(std::make_unique<FabArrayBase>(ba,dm,1,0)),
    fabArray(*m_fa),
    tile_size((do_tiling_) ? FabArrayBase::mfiter_tile_size : IntVect::TheZeroVector()),
    flags(do_tiling_ ? Tiling : 0),
    streams(Gpu::numGpuStreams()),
    dynamic(false),
    device_sync(true),
    index_map(nullptr),
    local_index_map(nullptr),
    tile_array(nullptr),
    local_tile_index_map(nullptr),
    num_local_tiles(nullptr)
{
#ifdef AMREX_USE_OMP
#pragma omp single
#endif
    {
        m_fa->addThisBD();
    }
    Initialize();
}